

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Upsert * sqlite3UpsertNew(sqlite3 *db,ExprList *pTarget,Expr *pTargetWhere,ExprList *pSet,
                         Expr *pWhere)

{
  Upsert *pNew;
  Expr *pWhere_local;
  ExprList *pSet_local;
  Expr *pTargetWhere_local;
  ExprList *pTarget_local;
  sqlite3 *db_local;
  
  db_local = (sqlite3 *)sqlite3DbMallocRaw(db,0x40);
  if (db_local == (sqlite3 *)0x0) {
    sqlite3ExprListDelete(db,pTarget);
    sqlite3ExprDelete(db,pTargetWhere);
    sqlite3ExprListDelete(db,pSet);
    sqlite3ExprDelete(db,pWhere);
    db_local = (sqlite3 *)0x0;
  }
  else {
    db_local->pVfs = (sqlite3_vfs *)pTarget;
    db_local->pVdbe = (Vdbe *)pTargetWhere;
    db_local->pDfltColl = (CollSeq *)pSet;
    db_local->mutex = (sqlite3_mutex *)pWhere;
    db_local->aDb = (Db *)0x0;
  }
  return (Upsert *)db_local;
}

Assistant:

SQLITE_PRIVATE Upsert *sqlite3UpsertNew(
  sqlite3 *db,           /* Determines which memory allocator to use */
  ExprList *pTarget,     /* Target argument to ON CONFLICT, or NULL */
  Expr *pTargetWhere,    /* Optional WHERE clause on the target */
  ExprList *pSet,        /* UPDATE columns, or NULL for a DO NOTHING */
  Expr *pWhere           /* WHERE clause for the ON CONFLICT UPDATE */
){
  Upsert *pNew;
  pNew = sqlite3DbMallocRaw(db, sizeof(Upsert));
  if( pNew==0 ){
    sqlite3ExprListDelete(db, pTarget);
    sqlite3ExprDelete(db, pTargetWhere);
    sqlite3ExprListDelete(db, pSet);
    sqlite3ExprDelete(db, pWhere);
    return 0;
  }else{
    pNew->pUpsertTarget = pTarget;
    pNew->pUpsertTargetWhere = pTargetWhere;
    pNew->pUpsertSet = pSet;
    pNew->pUpsertWhere = pWhere;
    pNew->pUpsertIdx = 0;
  }
  return pNew;
}